

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

void utf8_clipto(char *s,size_t n)

{
  bool bVar1;
  size_t sStack_28;
  _Bool terminate_next;
  size_t j;
  size_t i;
  size_t n_local;
  char *s_local;
  
  j = 0;
  sStack_28 = 0;
  bVar1 = false;
  if (n == 0) {
    *s = '\0';
  }
  else {
    for (; s[j] != '\0'; j = j + 1) {
      if (((int)s[j] & 0xc0U) != 0x80) {
        sStack_28 = sStack_28 + 1;
        if (bVar1) break;
        if (sStack_28 == n) {
          bVar1 = true;
        }
      }
    }
    s[j] = '\0';
  }
  return;
}

Assistant:

void utf8_clipto(char *s, size_t n)
{
	size_t i = 0, j = 0;
	bool terminate_next = false;

	if (n == 0) {
		s[i] = 0;
		return;
	}

	while (s[i]) {
		if ((s[i] & 0xc0) != 0x80) {
			j++;
			if (terminate_next)
				break;
			if (j == n)
				terminate_next = true;
		}
		i++;
	}
	s[i] = 0;
}